

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcoderaw.cc
# Opt level: O1

void __thiscall VarnodeData::restoreXml(VarnodeData *this,Element *el,AddrSpaceManager *manage)

{
  Translate *pTVar1;
  uintb uVar2;
  int iVar3;
  AddrSpace *pAVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  LowlevelError *this_00;
  uint uVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_00;
  
  this->space = (AddrSpace *)0x0;
  this->size = 0;
  uVar6 = (uint)((ulong)((long)(el->attr).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(el->attr).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar6) {
    lVar7 = 0;
    do {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((long)&(((el->attr).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar3 == 0) {
        pAVar4 = AddrSpaceManager::getSpaceByName
                           (manage,(string *)
                                   ((long)&(((el->value).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar7));
        this->space = pAVar4;
        if (pAVar4 != (AddrSpace *)0x0) {
          iVar3 = (*pAVar4->_vptr_AddrSpace[9])(pAVar4,el,&this->size);
          this->offset = CONCAT44(extraout_var,iVar3);
          return;
        }
        this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::operator+(&local_50,"Unknown space name: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(((el->value).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar7));
        LowlevelError::LowlevelError(this_00,&local_50);
        __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)((long)&(((el->attr).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      if (iVar3 == 0) {
        pTVar1 = manage->defaultspace->trans;
        iVar3 = (*(pTVar1->super_AddrSpaceManager)._vptr_AddrSpaceManager[7])
                          (pTVar1,(long)&(((el->value).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7);
        puVar5 = (undefined8 *)CONCAT44(extraout_var_00,iVar3);
        uVar2 = puVar5[1];
        this->space = (AddrSpace *)*puVar5;
        this->offset = uVar2;
        *(undefined8 *)&this->size = puVar5[2];
        return;
      }
      lVar7 = lVar7 + 0x20;
    } while ((ulong)(uVar6 & 0x7fffffff) << 5 != lVar7);
  }
  return;
}

Assistant:

void VarnodeData::restoreXml(const Element *el,const AddrSpaceManager *manage)

{
  space = (AddrSpace *)0;
  size = 0;
  int4 num = el->getNumAttributes();
  for(int4 i=0;i<num;++i) {
    if (el->getAttributeName(i)=="space") {
      space = manage->getSpaceByName(el->getAttributeValue(i));
      if (space == (AddrSpace *)0)
	throw LowlevelError("Unknown space name: "+el->getAttributeValue(i));
      offset = space->restoreXmlAttributes(el,size);
      return;
    }
    else if (el->getAttributeName(i)=="name") {
      const Translate *trans = manage->getDefaultSpace()->getTrans();
      const VarnodeData &point(trans->getRegister(el->getAttributeValue(i)));
      *this = point;
      return;
    }
  }
}